

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateSSEImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateSSEImpl<double,_2,_0>::calcEdgeLogLikelihoodsByPartition
          (BeagleCPU4StateSSEImpl<double,_2,_0> *this,int *parentBufferIndices,
          int *childBufferIndices,int *probabilityIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,double *outSumLogLikelihoodByPartition)

{
  long lVar1;
  double *pdVar2;
  long in_RCX;
  double *pdVar3;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int i_3;
  int k_3;
  double *scalingFactors;
  int in_stack_00000018;
  int i_2;
  double sumOverI;
  int k_2;
  int u;
  V_Real tmp_vcl_q23;
  V_Real tmp_vcl_q01;
  V_Real vcl_q3;
  V_Real vcl_q2;
  V_Real vcl_q1;
  V_Real vcl_q0;
  V_Real vwt_1;
  V_Real vclp_23;
  V_Real vclp_01;
  int k_1;
  int i_1;
  double *m1_1;
  VecUnion vu_m_1 [6] [2];
  V_Real *vcl_p_1;
  int l_1;
  int w_1;
  int v;
  V_Real *vcl_r_1;
  double *cl_q;
  V_Real wtdPartials;
  V_Real vwt;
  int stateChild;
  int k;
  V_Real *vcl_p;
  int i;
  double *m1;
  VecUnion vu_m [6] [2];
  int l;
  V_Real *vcl_r;
  int w;
  int *statesChild;
  double *freqs;
  double *wt;
  double *transMatrix;
  double *cl_r;
  int scalingFactorsIndex;
  int stateFrequenciesIndex;
  int categoryWeightsIndex;
  int probIndex;
  int childIndex;
  int parIndex;
  int endPattern;
  int startPattern;
  int pIndex;
  int p;
  double *cl_p;
  int local_6f0;
  int local_6ec;
  int local_6dc;
  double local_6d8;
  int local_6d0;
  int local_6cc;
  int local_638;
  int local_634;
  double *local_630;
  double local_628 [25];
  double *local_560;
  int local_554;
  int local_550;
  int local_54c;
  double *local_548;
  long local_540;
  double local_538;
  double dStack_530;
  double local_528;
  double dStack_520;
  int local_518;
  int local_514;
  double *local_510;
  int local_504;
  double *local_500;
  double local_4f8 [24];
  int local_434;
  double *local_430;
  int local_424;
  long local_420;
  long local_418;
  long local_410;
  long local_408;
  long local_400;
  int local_3f8;
  int local_3f4;
  int local_3f0;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  int local_3e0;
  int local_3dc;
  int local_3d8;
  int local_3d4;
  long local_3d0;
  long local_3c8;
  long local_3c0;
  long local_3b8;
  long local_3b0;
  long local_3a8;
  double local_398;
  double dStack_390;
  double local_380;
  double local_378;
  double dStack_370;
  double local_360;
  double local_358;
  double dStack_350;
  double local_348;
  double dStack_340;
  double local_338;
  double dStack_330;
  double local_328;
  double dStack_320;
  double local_318;
  double dStack_310;
  double local_308;
  double dStack_300;
  double local_2f8;
  double dStack_2f0;
  double local_2e8;
  double dStack_2e0;
  double local_2c8;
  double dStack_2c0;
  double local_2a8;
  double dStack_2a0;
  double local_288;
  double dStack_280;
  double local_268;
  double dStack_260;
  double local_248;
  double dStack_240;
  double local_228;
  double dStack_220;
  double local_208;
  double dStack_200;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  undefined1 local_148 [16];
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  undefined1 local_48 [16];
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  double *local_10;
  double *local_8;
  
  local_3d0 = *(long *)(in_RDI + 0xe0);
  local_3c8 = in_R9;
  local_3c0 = in_R8;
  local_3b8 = in_RCX;
  local_3b0 = in_RDX;
  local_3a8 = in_RSI;
  for (local_3d4 = 0; local_3d4 < in_stack_00000018; local_3d4 = local_3d4 + 1) {
    local_3d8 = *(int *)((long)scalingFactors + (long)local_3d4 * 4);
    local_3dc = *(int *)(*(long *)(in_RDI + 0x90) + (long)local_3d8 * 4);
    local_3e0 = *(int *)(*(long *)(in_RDI + 0x90) + (long)(local_3d8 + 1) * 4);
    memset((void *)(local_3d0 + (long)(local_3dc * *(int *)(in_RDI + 0x24)) * 8),0,
           (long)((local_3e0 - local_3dc) * *(int *)(in_RDI + 0x24)) << 3);
    local_3e4 = *(int *)(local_3a8 + (long)local_3d4 * 4);
    local_3e8 = *(int *)(local_3b0 + (long)local_3d4 * 4);
    local_3ec = *(int *)(local_3b8 + (long)local_3d4 * 4);
    local_3f0 = *(int *)(local_3c0 + (long)local_3d4 * 4);
    local_3f4 = *(int *)(local_3c8 + (long)local_3d4 * 4);
    local_3f8 = *(int *)(_i_3 + (long)local_3d4 * 4);
    local_400 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)local_3e4 * 8);
    local_408 = *(long *)(*(long *)(in_RDI + 0xd8) + (long)local_3ec * 8);
    local_410 = *(long *)(*(long *)(in_RDI + 0xa0) + (long)local_3f0 * 8);
    local_418 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)local_3f4 * 8);
    if ((local_3e8 < *(int *)(in_RDI + 0x10)) &&
       (*(long *)(*(long *)(in_RDI + 0xb8) + (long)local_3e8 * 8) != 0)) {
      local_420 = *(long *)(*(long *)(in_RDI + 0xb8) + (long)local_3e8 * 8);
      local_424 = 0;
      local_430 = (double *)(local_400 + (long)(local_3dc << 2) * 8);
      for (local_434 = 0; local_434 < *(int *)(in_RDI + 0x34); local_434 = local_434 + 1) {
        local_500 = (double *)(local_408 + (long)local_424 * 8);
        for (local_504 = 0; local_504 < 6; local_504 = local_504 + 1) {
          local_4f8[(long)local_504 * 4] = *local_500;
          local_4f8[(long)local_504 * 4 + 1] = local_500[6];
          local_4f8[(long)local_504 * 4 + 2] = local_500[0xc];
          local_4f8[(long)local_504 * 4 + 3] = local_500[0x12];
          local_500 = local_500 + 1;
        }
        local_510 = (double *)(local_3d0 + (long)(local_3dc << 2) * 8);
        for (local_514 = local_3dc; pdVar2 = local_430, local_514 < local_3e0;
            local_514 = local_514 + 1) {
          local_518 = *(int *)(local_420 + (long)local_514 * 4);
          local_528 = *(double *)(local_410 + (long)local_434 * 8);
          local_360 = local_528;
          local_378 = local_528;
          dStack_370 = local_528;
          pdVar3 = local_430 + 2;
          local_430 = pdVar3;
          local_168 = *pdVar2;
          dStack_160 = pdVar2[1];
          local_178 = local_528;
          dStack_170 = local_528;
          local_198 = *pdVar2 * local_528;
          dStack_190 = pdVar2[1] * local_528;
          local_188 = local_4f8[(long)local_518 * 4];
          dStack_180 = local_4f8[(long)local_518 * 4 + 1];
          local_28 = local_4f8[(long)local_518 * 4] * local_198;
          dStack_20 = local_4f8[(long)local_518 * 4 + 1] * dStack_190;
          local_38 = *local_510;
          dStack_30 = local_510[1];
          *local_510 = local_28 + *local_510;
          local_510[1] = dStack_20 + local_510[1];
          local_430 = pdVar2 + 4;
          local_1a8 = *pdVar3;
          dStack_1a0 = pdVar2[3];
          local_1b8 = local_528;
          dStack_1b0 = local_528;
          local_538 = local_1a8 * local_528;
          dStack_530 = pdVar2[3] * local_528;
          local_1c8 = local_4f8[(long)local_518 * 4 + 2];
          dStack_1c0 = local_4f8[(long)local_518 * 4 + 3];
          local_1d8 = local_538;
          dStack_1d0 = dStack_530;
          local_48._0_8_ = local_4f8[(long)local_518 * 4 + 2] * local_538;
          local_48._8_8_ = local_4f8[(long)local_518 * 4 + 3] * dStack_530;
          local_58 = *(double *)*(undefined1 (*) [16])(local_510 + 2);
          dStack_50 = local_510[3];
          auVar5._0_8_ = local_48._0_8_ + local_58;
          auVar5._8_8_ = local_48._8_8_ + local_510[3];
          *(undefined1 (*) [16])(local_510 + 2) = auVar5;
          local_510 = local_510 + 4;
          dStack_520 = local_528;
        }
        local_424 = local_424 + 0x18;
        local_430 = local_430 +
                    (long)(*(int *)(in_RDI + 0x1c) << 1) * 2 +
                    (long)(((*(int *)(in_RDI + 0x14) - local_3e0) + local_3dc) * 2) * 2;
      }
    }
    else {
      local_540 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)local_3e8 * 8);
      local_548 = (double *)(local_400 + (long)(local_3dc << 2) * 8);
      local_54c = local_3dc << 2;
      local_550 = 0;
      for (local_554 = 0; local_554 < *(int *)(in_RDI + 0x34); local_554 = local_554 + 1) {
        local_560 = (double *)(local_3d0 + (long)(local_3dc << 2) * 8);
        local_630 = (double *)(local_408 + (long)local_550 * 8);
        for (local_634 = 0; local_634 < 6; local_634 = local_634 + 1) {
          local_628[(long)local_634 * 4] = *local_630;
          local_628[(long)local_634 * 4 + 1] = local_630[6];
          local_628[(long)local_634 * 4 + 2] = local_630[0xc];
          local_628[(long)local_634 * 4 + 3] = local_630[0x12];
          local_630 = local_630 + 1;
        }
        for (local_638 = local_3dc; local_638 < local_3e0; local_638 = local_638 + 1) {
          local_398 = *(double *)(local_410 + (long)local_554 * 8);
          local_8 = (double *)(local_540 + (long)local_54c * 8);
          local_268 = *local_8;
          local_288 = local_8[1];
          local_10 = (double *)(local_540 + 0x10 + (long)local_54c * 8);
          local_2a8 = *local_10;
          local_2c8 = local_10[1];
          local_78 = local_268 * local_628[0];
          dStack_70 = local_268 * local_628[1];
          local_68 = local_288 * local_628[4];
          dStack_60 = local_288 * local_628[5];
          local_98 = local_68 + local_78;
          dStack_90 = dStack_60 + dStack_70;
          local_88 = local_2a8 * local_628[8];
          dStack_80 = local_2a8 * local_628[9];
          local_b8 = local_88 + local_98;
          dStack_b0 = dStack_80 + dStack_90;
          local_a8 = local_2c8 * local_628[0xc];
          dStack_a0 = local_2c8 * local_628[0xd];
          local_2e8 = local_a8 + local_b8;
          dStack_2e0 = dStack_a0 + dStack_b0;
          local_d8 = local_268 * local_628[2];
          dStack_d0 = local_268 * local_628[3];
          local_c8 = local_288 * local_628[6];
          dStack_c0 = local_288 * local_628[7];
          local_f8 = local_c8 + local_d8;
          dStack_f0 = dStack_c0 + dStack_d0;
          local_e8 = local_2a8 * local_628[10];
          dStack_e0 = local_2a8 * local_628[0xb];
          local_118 = local_e8 + local_f8;
          dStack_110 = dStack_e0 + dStack_f0;
          local_108 = local_2c8 * local_628[0xe];
          dStack_100 = local_2c8 * local_628[0xf];
          local_308 = local_108 + local_118;
          dStack_300 = dStack_100 + dStack_110;
          local_328 = local_2e8 * local_398;
          dStack_320 = dStack_2e0 * local_398;
          local_348 = local_308 * local_398;
          dStack_340 = dStack_300 * local_398;
          local_338 = *local_548;
          dStack_330 = local_548[1];
          local_128 = local_328 * local_338;
          dStack_120 = dStack_320 * dStack_330;
          local_138 = *local_560;
          dStack_130 = local_560[1];
          *local_560 = local_128 + local_138;
          local_560[1] = dStack_120 + dStack_130;
          local_358 = local_548[2];
          dStack_350 = local_548[3];
          local_148._0_8_ = local_348 * local_358;
          local_148._8_8_ = dStack_340 * dStack_350;
          local_158 = *(double *)*(undefined1 (*) [16])(local_560 + 2);
          dStack_150 = local_560[3];
          auVar6._0_8_ = local_148._0_8_ + local_158;
          auVar6._8_8_ = local_148._8_8_ + dStack_150;
          *(undefined1 (*) [16])(local_560 + 2) = auVar6;
          local_560 = local_560 + 4;
          local_54c = local_54c + 4;
          local_548 = local_548 + 4;
          dStack_390 = local_398;
          local_380 = local_398;
          local_318 = local_398;
          dStack_310 = local_398;
          local_2f8 = local_398;
          dStack_2f0 = local_398;
          dStack_2c0 = local_2c8;
          dStack_2a0 = local_2a8;
          dStack_280 = local_288;
          dStack_260 = local_268;
          local_248 = local_2c8;
          dStack_240 = local_2c8;
          local_228 = local_2a8;
          dStack_220 = local_2a8;
          local_208 = local_288;
          dStack_200 = local_288;
          local_1e8 = local_268;
          dStack_1e0 = local_268;
        }
        local_550 = local_550 + 0x18;
        if (*(int *)(in_RDI + 0x1c) != 0) {
          local_548 = local_548 + (long)(*(int *)(in_RDI + 0x1c) << 1) * 2;
          local_54c = *(int *)(in_RDI + 0x1c) * 4 + local_54c;
        }
        local_548 = local_548 + (long)(((*(int *)(in_RDI + 0x14) - local_3e0) + local_3dc) * 2) * 2;
        local_54c = ((*(int *)(in_RDI + 0x14) - local_3e0) + local_3dc) * 4 + local_54c;
      }
    }
    local_6cc = local_3dc << 2;
    for (local_6d0 = local_3dc; local_6d0 < local_3e0; local_6d0 = local_6d0 + 1) {
      local_6d8 = 0.0;
      for (local_6dc = 0; local_6dc < *(int *)(in_RDI + 0x24); local_6dc = local_6dc + 1) {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(ulong *)(local_418 + (long)local_6dc * 8);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = *(ulong *)(local_3d0 + (long)local_6cc * 8);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_6d8;
        auVar6 = vfmadd213sd_fma(auVar7,auVar9,auVar11);
        local_6d8 = auVar6._0_8_;
        local_6cc = local_6cc + 1;
      }
      dVar4 = log(local_6d8);
      *(double *)(*(long *)(in_RDI + 0x110) + (long)local_6d0 * 8) = dVar4;
    }
    if (local_3f8 != -1) {
      lVar1 = *(long *)(*(long *)(in_RDI + 0xc0) + (long)local_3f8 * 8);
      for (local_6ec = local_3dc; local_6ec < local_3e0; local_6ec = local_6ec + 1) {
        *(double *)(*(long *)(in_RDI + 0x110) + (long)local_6ec * 8) =
             *(double *)(lVar1 + (long)local_6ec * 8) +
             *(double *)(*(long *)(in_RDI + 0x110) + (long)local_6ec * 8);
      }
    }
    *(undefined8 *)((long)sumOverI + (long)local_3d4 * 8) = 0;
    for (local_6f0 = local_3dc; local_6f0 < local_3e0; local_6f0 = local_6f0 + 1) {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x110) + (long)local_6f0 * 8);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x80) + (long)local_6f0 * 8);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *(ulong *)((long)sumOverI + (long)local_3d4 * 8);
      auVar6 = vfmadd213sd_fma(auVar8,auVar10,auVar12);
      *(long *)((long)sumOverI + (long)local_3d4 * 8) = auVar6._0_8_;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_4_SSE_TEMPLATE
void BeagleCPU4StateSSEImpl<BEAGLE_CPU_4_SSE_DOUBLE>::calcEdgeLogLikelihoodsByPartition(
                                                  const int* parentBufferIndices,
                                                  const int* childBufferIndices,
                                                  const int* probabilityIndices,
                                                  const int* categoryWeightsIndices,
                                                  const int* stateFrequenciesIndices,
                                                  const int* cumulativeScaleIndices,
                                                  const int* partitionIndices,
                                                  int partitionCount,
                                                  double* outSumLogLikelihoodByPartition) {



    double* cl_p = integrationTmp;

    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        memset(&cl_p[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(double));

        const int parIndex = parentBufferIndices[p];
        const int childIndex = childBufferIndices[p];
        const int probIndex = probabilityIndices[p];
        const int categoryWeightsIndex = categoryWeightsIndices[p];
        const int stateFrequenciesIndex = stateFrequenciesIndices[p];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];

        assert(parIndex >= kTipCount);

        const double* cl_r = gPartials[parIndex];
        const double* transMatrix = gTransitionMatrices[probIndex];
        const double* wt = gCategoryWeights[categoryWeightsIndex];
        const double* freqs = gStateFrequencies[stateFrequenciesIndex];


        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];

            int w = 0;
            V_Real *vcl_r = (V_Real *) (cl_r + startPattern * 4);
            for(int l = 0; l < kCategoryCount; l++) {

                VecUnion vu_m[OFFSET][2];
                SSE_PREFETCH_MATRIX(transMatrix + w, vu_m)

               V_Real *vcl_p = (V_Real *) (cl_p + startPattern * 4);

               for(int k = startPattern; k < endPattern; k++) {

                    const int stateChild = statesChild[k];
                    V_Real vwt = VEC_SPLAT(wt[l]);

                    V_Real wtdPartials = VEC_MULT(*vcl_r++, vwt);
                    *vcl_p = VEC_MADD(vu_m[stateChild][0].vx, wtdPartials, *vcl_p);
                    vcl_p++;

                    wtdPartials = VEC_MULT(*vcl_r++, vwt);
                    *vcl_p = VEC_MADD(vu_m[stateChild][1].vx, wtdPartials, *vcl_p);
                    vcl_p++;
                }
               w += OFFSET*4;
               vcl_r += 2 * kExtraPatterns;
               vcl_r += ((kPatternCount - endPattern) + startPattern) * 2;
            }
        } else { // Integrate against a partial at the child

            const double* cl_q = gPartials[childIndex];
            V_Real * vcl_r = (V_Real *)  (cl_r + startPattern * 4);
            int v = startPattern * 4;
            int w = 0;

            for(int l = 0; l < kCategoryCount; l++) {

                V_Real * vcl_p = (V_Real *) (cl_p + startPattern * 4);

                VecUnion vu_m[OFFSET][2];
                SSE_PREFETCH_MATRIX(transMatrix + w, vu_m)

                for(int k = startPattern; k < endPattern; k++) {
                    V_Real vclp_01, vclp_23;
                    V_Real vwt = VEC_SPLAT(wt[l]);

                    V_Real vcl_q0, vcl_q1, vcl_q2, vcl_q3;
                    SSE_PREFETCH_PARTIALS(vcl_q,cl_q,v);

                    vclp_01 = VEC_MULT(vcl_q0, vu_m[0][0].vx);
                    vclp_01 = VEC_MADD(vcl_q1, vu_m[1][0].vx, vclp_01);
                    vclp_01 = VEC_MADD(vcl_q2, vu_m[2][0].vx, vclp_01);
                    vclp_01 = VEC_MADD(vcl_q3, vu_m[3][0].vx, vclp_01);
                    vclp_23 = VEC_MULT(vcl_q0, vu_m[0][1].vx);
                    vclp_23 = VEC_MADD(vcl_q1, vu_m[1][1].vx, vclp_23);
                    vclp_23 = VEC_MADD(vcl_q2, vu_m[2][1].vx, vclp_23);
                    vclp_23 = VEC_MADD(vcl_q3, vu_m[3][1].vx, vclp_23);
                    vclp_01 = VEC_MULT(vclp_01, vwt);
                    vclp_23 = VEC_MULT(vclp_23, vwt);

                    *vcl_p = VEC_MADD(vclp_01, *vcl_r++, *vcl_p);
                    vcl_p++;
                    *vcl_p = VEC_MADD(vclp_23, *vcl_r++, *vcl_p);
                    vcl_p++;

                    v += 4;
                }
                w += 4*OFFSET;
                if (kExtraPatterns) {
                    vcl_r += 2 * kExtraPatterns;
                    v += 4 * kExtraPatterns;
                }

               vcl_r += ((kPatternCount - endPattern) + startPattern) * 2;
               v     += ((kPatternCount - endPattern) + startPattern) * 4;

            }
        }

        int u = startPattern * 4;
        for(int k = startPattern; k < endPattern; k++) {
            double sumOverI = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * cl_p[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sumOverI);
        }


        if (scalingFactorsIndex != BEAGLE_OP_NONE) {
            const double* scalingFactors = gScaleBuffers[scalingFactorsIndex];
            for(int k=startPattern; k < endPattern; k++)
                outLogLikelihoodsTmp[k] += scalingFactors[k];
        }

        outSumLogLikelihoodByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p] += outLogLikelihoodsTmp[i] * gPatternWeights[i];
        }

    }
}